

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::SetLoopBodyEntryPoint
          (FunctionBody *this,LoopHeader *loopHeader,EntryPointInfo *entryPointInfo,
          JavascriptMethod entryPoint,uint loopNum)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  LoopHeader **ppLVar7;
  undefined4 *puVar8;
  uint *puVar9;
  LoopEntryPointInfo *this_00;
  FunctionBody *this_01;
  uint local_34;
  uint local_30;
  uint local_2c;
  JavascriptMethod p_Stack_28;
  uint loopNum_local;
  JavascriptMethod entryPoint_local;
  EntryPointInfo *entryPointInfo_local;
  LoopHeader *loopHeader_local;
  FunctionBody *this_local;
  
  local_2c = loopNum;
  p_Stack_28 = entryPoint;
  entryPoint_local = (JavascriptMethod)entryPointInfo;
  entryPointInfo_local = (EntryPointInfo *)loopHeader;
  loopHeader_local = (LoopHeader *)this;
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,JITLoopBodyPhase);
  if (bVar2) {
    DumpFunctionId(this,true);
    iVar4 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    Output::Print(L": %-20s LoopBody EntryPt  Loop: %2d Address : %x\n",CONCAT44(extraout_var,iVar4)
                  ,(ulong)local_2c,p_Stack_28);
    Output::Flush();
  }
  ppLVar7 = Memory::WriteBarrierPtr::operator_cast_to_LoopHeader__
                      ((WriteBarrierPtr *)(entryPoint_local + 0x60));
  if ((EntryPointInfo *)*ppLVar7 != entryPointInfo_local) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xfb0,
                                "(((LoopEntryPointInfo*)entryPointInfo)->loopHeader == loopHeader)",
                                "((LoopEntryPointInfo*)entryPointInfo)->loopHeader == loopHeader");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (*(long *)(entryPoint_local + 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xfb1,
                                "(reinterpret_cast<void*>(entryPointInfo->jsMethod) == nullptr)",
                                "reinterpret_cast<void*>(entryPointInfo->jsMethod) == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  *(JavascriptMethod *)(entryPoint_local + 0x10) = p_Stack_28;
  uVar5 = DAT_01ebb8b8 & 0xff;
  bVar3 = LoopEntryPointInfo::GetDecrLoopCountPerBailout();
  local_30 = uVar5 * (bVar3 - 1);
  local_34 = 0xff;
  puVar9 = min<unsigned_int>(&local_30,&local_34);
  *(uint *)(entryPoint_local + 0x6c) = *puVar9 & 0xff;
  this_00 = LoopHeader::GetCurrentEntryPointInfo((LoopHeader *)entryPointInfo_local);
  bVar2 = EntryPointInfo::GetIsAsmJSFunction(&this_00->super_EntryPointInfo);
  if (bVar2) {
    this_01 = (FunctionBody *)(**(code **)(*(long *)entryPoint_local + 0x58))();
    uVar6 = GetLoopInterpretCount(this_01,(LoopHeader *)entryPointInfo_local);
    *(uint *)&(entryPointInfo_local->super_ProxyEntryPointInfo).jsMethod = uVar6 - 1;
  }
  VTuneChakraProfile::LogLoopBodyLoadEvent
            (this,(LoopEntryPointInfo *)entryPoint_local,(uint16)local_2c);
  return;
}

Assistant:

void FunctionBody::SetLoopBodyEntryPoint(Js::LoopHeader * loopHeader, EntryPointInfo* entryPointInfo, Js::JavascriptMethod entryPoint, uint loopNum)
    {
#if DBG_DUMP
        if (PHASE_TRACE1(Js::JITLoopBodyPhase))
        {
            DumpFunctionId(true);
            Output::Print(_u(": %-20s LoopBody EntryPt  Loop: %2d Address : %x\n"), GetDisplayName(), loopNum, entryPoint);
            Output::Flush();
        }
#endif
        Assert(((LoopEntryPointInfo*)entryPointInfo)->loopHeader == loopHeader);
        Assert(reinterpret_cast<void*>(entryPointInfo->jsMethod) == nullptr);
        entryPointInfo->jsMethod = entryPoint;

        ((Js::LoopEntryPointInfo*)entryPointInfo)->totalJittedLoopIterations =
            static_cast<uint8>(
                min(
                    static_cast<uint>(static_cast<uint8>(CONFIG_FLAG(MinBailOutsBeforeRejitForLoops))) *
                    (Js::LoopEntryPointInfo::GetDecrLoopCountPerBailout() - 1),
                    0xffu));

        // reset the counter to 1 less than the threshold for TJLoopBody
        if (loopHeader->GetCurrentEntryPointInfo()->GetIsAsmJSFunction())
        {
            loopHeader->interpretCount = entryPointInfo->GetFunctionBody()->GetLoopInterpretCount(loopHeader) - 1;
        }
        JS_ETW(EtwTrace::LogLoopBodyLoadEvent(this, ((LoopEntryPointInfo*)entryPointInfo), ((uint16)loopNum)));
#ifdef VTUNE_PROFILING
        VTuneChakraProfile::LogLoopBodyLoadEvent(this, ((LoopEntryPointInfo*)entryPointInfo), ((uint16)loopNum));
#endif
    }